

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecCorr.c
# Opt level: O1

uint * Cec_ManComputeInitState(Gia_Man_t *pAig,int nFrames)

{
  int iVar1;
  int iVar2;
  Gia_Obj_t *pGVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  Vec_Int_t *pVVar7;
  long lVar8;
  uint *puVar9;
  ulong uVar10;
  long lVar11;
  uint uVar12;
  uint uVar13;
  
  Gia_ManRandom(1);
  iVar6 = pAig->nRegs;
  if (0 < iVar6) {
    iVar4 = 0;
    do {
      iVar5 = pAig->vCis->nSize;
      uVar12 = (iVar5 - iVar6) + iVar4;
      if (((int)uVar12 < 0) || (iVar5 <= (int)uVar12)) goto LAB_005a8746;
      iVar6 = pAig->vCis->pArray[uVar12];
      if (((long)iVar6 < 0) || (pAig->nObjs <= iVar6)) goto LAB_005a8727;
      if (pAig->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar3 = pAig->pObjs + iVar6;
      *(ulong *)pGVar3 = *(ulong *)pGVar3 & 0xbfffffffffffffff;
      iVar4 = iVar4 + 1;
      iVar6 = pAig->nRegs;
    } while (iVar4 < iVar6);
  }
  if (0 < nFrames) {
    iVar6 = 0;
    do {
      *(ulong *)pAig->pObjs = *(ulong *)pAig->pObjs & 0xbfffffffffffffff;
      pVVar7 = pAig->vCis;
      uVar10 = (ulong)(uint)pVVar7->nSize;
      if (pAig->nRegs < pVVar7->nSize) {
        lVar11 = 0;
        do {
          if ((int)uVar10 <= lVar11) goto LAB_005a8746;
          lVar8 = (long)pVVar7->pArray[lVar11];
          if ((lVar8 < 0) || (pAig->nObjs <= pVVar7->pArray[lVar11])) goto LAB_005a8727;
          pGVar3 = pAig->pObjs;
          if (pGVar3 == (Gia_Obj_t *)0x0) break;
          uVar12 = Gia_ManRandom(0);
          *(ulong *)(pGVar3 + lVar8) =
               *(ulong *)(pGVar3 + lVar8) & 0xbfffffffffffffff | (ulong)(uVar12 & 1) << 0x3e;
          lVar11 = lVar11 + 1;
          pVVar7 = pAig->vCis;
          uVar10 = (ulong)pVVar7->nSize;
        } while (lVar11 < (long)(uVar10 - (long)pAig->nRegs));
      }
      if (0 < pAig->nObjs) {
        lVar11 = 0;
        lVar8 = 0;
        do {
          pGVar3 = pAig->pObjs;
          if (pGVar3 == (Gia_Obj_t *)0x0) break;
          uVar10 = *(ulong *)(&pGVar3->field_0x0 + lVar11);
          if ((uVar10 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar10) {
            *(ulong *)(&pGVar3->field_0x0 + lVar11) =
                 uVar10 & 0xbfffffff7fffffff |
                 ((ulong)(((uint)(uVar10 >> 0x3d) ^
                          (uint)((ulong)*(undefined8 *)
                                         ((long)pGVar3 +
                                         (ulong)((uint)(uVar10 >> 0x1e) & 0x7ffffffc) * -3 + lVar11)
                                >> 0x3e)) &
                         ((uint)((ulong)*(undefined8 *)
                                         ((long)pGVar3 +
                                         (ulong)(uint)((int)(uVar10 & 0x1fffffff) << 2) * -3 +
                                         lVar11) >> 0x3e) ^ (uint)(uVar10 >> 0x1d) & 7)) & 1) <<
                 0x3e;
          }
          lVar8 = lVar8 + 1;
          lVar11 = lVar11 + 0xc;
        } while (lVar8 < pAig->nObjs);
      }
      iVar4 = pAig->nRegs;
      if (0 < iVar4) {
        iVar5 = 0;
        do {
          iVar1 = pAig->vCos->nSize;
          uVar12 = (iVar1 - iVar4) + iVar5;
          if (((int)uVar12 < 0) || (iVar1 <= (int)uVar12)) goto LAB_005a8746;
          iVar4 = pAig->vCos->pArray[uVar12];
          if (((long)iVar4 < 0) || (pAig->nObjs <= iVar4)) goto LAB_005a8727;
          if (pAig->pObjs == (Gia_Obj_t *)0x0) break;
          pGVar3 = pAig->pObjs + iVar4;
          uVar10 = *(ulong *)pGVar3;
          *(ulong *)pGVar3 =
               uVar10 & 0xbfffffffffffffff |
               (uVar10 << 0x21 ^ *(ulong *)(pGVar3 + -(ulong)((uint)uVar10 & 0x1fffffff))) &
               0x4000000000000000;
          iVar5 = iVar5 + 1;
          iVar4 = pAig->nRegs;
        } while (iVar5 < iVar4);
      }
      iVar4 = pAig->nRegs;
      if (0 < iVar4) {
        iVar5 = 0;
        do {
          iVar1 = pAig->vCos->nSize;
          uVar12 = (iVar1 - iVar4) + iVar5;
          if (((int)uVar12 < 0) || (iVar1 <= (int)uVar12)) goto LAB_005a8746;
          iVar1 = pAig->vCos->pArray[uVar12];
          if ((long)iVar1 < 0) goto LAB_005a8727;
          if (pAig->nObjs <= iVar1) goto LAB_005a8727;
          pGVar3 = pAig->pObjs;
          if (pGVar3 == (Gia_Obj_t *)0x0) break;
          iVar2 = pAig->vCis->nSize;
          uVar12 = (iVar2 - iVar4) + iVar5;
          if (((int)uVar12 < 0) || (iVar2 <= (int)uVar12)) goto LAB_005a8746;
          iVar4 = pAig->vCis->pArray[uVar12];
          lVar11 = (long)iVar4;
          if ((lVar11 < 0) || (pAig->nObjs <= iVar4)) goto LAB_005a8727;
          *(ulong *)(pGVar3 + lVar11) =
               *(ulong *)(pGVar3 + lVar11) & 0xbfffffffffffffff |
               *(ulong *)(pGVar3 + iVar1) & 0x4000000000000000;
          iVar5 = iVar5 + 1;
          iVar4 = pAig->nRegs;
        } while (iVar5 < iVar4);
      }
      iVar6 = iVar6 + 1;
    } while (iVar6 != nFrames);
  }
  uVar12 = pAig->nRegs;
  puVar9 = (uint *)calloc((long)(int)((((int)uVar12 >> 5) + 1) - (uint)((uVar12 & 0x1f) == 0)),4);
  if (0 < (long)(int)uVar12) {
    pVVar7 = pAig->vCis;
    iVar6 = pVVar7->nSize;
    uVar13 = iVar6 - uVar12;
    uVar10 = 0;
    do {
      iVar4 = uVar13 + (int)uVar10;
      if ((iVar4 < 0) || (iVar6 <= iVar4)) {
LAB_005a8746:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar4 = pVVar7->pArray[uVar13 + uVar10];
      if (((long)iVar4 < 0) || (pAig->nObjs <= iVar4)) {
LAB_005a8727:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (pAig->pObjs == (Gia_Obj_t *)0x0) break;
      if (((undefined1  [12])pAig->pObjs[iVar4] & (undefined1  [12])0x4000000000000000) !=
          (undefined1  [12])0x0) {
        puVar9[uVar10 >> 5 & 0x7ffffff] =
             puVar9[uVar10 >> 5 & 0x7ffffff] | 1 << ((byte)uVar10 & 0x1f);
      }
      uVar10 = uVar10 + 1;
    } while ((long)(int)uVar12 != uVar10);
  }
  Gia_ManCleanMark1(pAig);
  return puVar9;
}

Assistant:

unsigned * Cec_ManComputeInitState( Gia_Man_t * pAig, int nFrames )
{  
    Gia_Obj_t * pObj, * pObjRo, * pObjRi;
    unsigned * pInitState;
    int i, f; 
    Gia_ManRandom( 1 );
//    Abc_Print( 1, "Simulating %d timeframes.\n", nFrames );
    Gia_ManForEachRo( pAig, pObj, i )
        pObj->fMark1 = 0;
    for ( f = 0; f < nFrames; f++ )
    {
        Gia_ManConst0(pAig)->fMark1 = 0;
        Gia_ManForEachPi( pAig, pObj, i )
            pObj->fMark1 = Gia_ManRandom(0) & 1;
        Gia_ManForEachAnd( pAig, pObj, i )
            pObj->fMark1 = (Gia_ObjFanin0(pObj)->fMark1 ^ Gia_ObjFaninC0(pObj)) & 
                (Gia_ObjFanin1(pObj)->fMark1 ^ Gia_ObjFaninC1(pObj));
        Gia_ManForEachRi( pAig, pObj, i )
            pObj->fMark1 = (Gia_ObjFanin0(pObj)->fMark1 ^ Gia_ObjFaninC0(pObj));
        Gia_ManForEachRiRo( pAig, pObjRi, pObjRo, i )
            pObjRo->fMark1 = pObjRi->fMark1;
    }
    pInitState = ABC_CALLOC( unsigned, Abc_BitWordNum(Gia_ManRegNum(pAig)) );
    Gia_ManForEachRo( pAig, pObj, i )
    {
        if ( pObj->fMark1 )
            Abc_InfoSetBit( pInitState, i );
//        Abc_Print( 1, "%d", pObj->fMark1 );
    }
//    Abc_Print( 1, "\n" );
    Gia_ManCleanMark1( pAig );
    return pInitState;
}